

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  typed_option<float> *nmemb;
  pointer pOVar5;
  float *pfVar6;
  float **ppfVar7;
  example **ppeVar8;
  pointer pOVar9;
  learner<OjaNewton,_example> *this;
  vw *in_RSI;
  long *in_RDI;
  __type_conflict __x;
  learner<OjaNewton,_example> *l;
  int i;
  option_group_definition new_options;
  string random_init;
  string normalize;
  float alpha_inverse;
  bool oja_newton;
  free_ptr<OjaNewton> ON;
  undefined4 in_stack_ffffffffffffef98;
  uint32_t in_stack_ffffffffffffef9c;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffefa0;
  string *in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefb0;
  uint32_t in_stack_ffffffffffffefb4;
  _func_void_OjaNewton_ptr *f;
  learner<OjaNewton,_example> *this_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffefe8;
  option_group_definition *in_stack_ffffffffffffeff0;
  int local_dc0;
  allocator local_db9;
  string local_db8 [32];
  undefined4 local_d98;
  allocator local_d91;
  string local_d90 [39];
  allocator local_d69;
  string local_d68 [39];
  allocator local_d41;
  string local_d40 [359];
  allocator local_bd9;
  string local_bd8 [39];
  allocator local_bb1;
  string local_bb0 [359];
  allocator local_a49;
  string local_a48 [39];
  allocator local_a21;
  string local_a20 [359];
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [359];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [359];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [359];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [359];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  typed_option<bool> local_230 [2];
  allocator local_e9;
  string local_e8 [32];
  undefined1 local_c8 [63];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  float local_30;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<OjaNewton>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"true",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"true",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"OjaNewton options",&local_e9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffefa0,
             (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"OjaNewton",&local_251);
  VW::config::make_option<bool>(in_stack_ffffffffffffefa8,(bool *)in_stack_ffffffffffffefa0);
  VW::config::typed_option<bool>::keep(local_230,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"Online Newton with Oja\'s Sketch",&local_279);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffefa0,
             (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffefa0,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffeff0,(typed_option<bool> *)in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"sketch_size",&local_3e1);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30734e);
  VW::config::make_option<int>(in_stack_ffffffffffffefa8,(int *)in_stack_ffffffffffffefa0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"size of sketch",&local_409);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffefa0,
             (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_ffffffffffffefa0,
             (typed_option<int> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<int>
            (in_stack_ffffffffffffeff0,(typed_option<int> *)in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"epoch_size",&local_571);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x307450);
  VW::config::make_option<int>(in_stack_ffffffffffffefa8,(int *)in_stack_ffffffffffffefa0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"size of epoch",&local_599);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffefa0,
             (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_ffffffffffffefa0,
             (typed_option<int> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<int>
            (in_stack_ffffffffffffeff0,(typed_option<int> *)in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"alpha",&local_701);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x307552);
  VW::config::make_option<float>(in_stack_ffffffffffffefa8,(float *)in_stack_ffffffffffffefa0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             (float)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"mutiplicative constant for indentiy",&local_729);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffefa0,
             (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffefa0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffeff0,(typed_option<float> *)in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"alpha_inverse",&local_891);
  VW::config::make_option<float>(in_stack_ffffffffffffefa8,(float *)in_stack_ffffffffffffefa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b8,"one over alpha, similar to learning rate",&local_8b9);
  nmemb = VW::config::typed_option<float>::help
                    ((typed_option<float> *)in_stack_ffffffffffffefa0,
                     (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffefa0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffeff0,(typed_option<float> *)in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a20,"learning_rate_cnt",&local_a21);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x307731);
  VW::config::make_option<float>(in_stack_ffffffffffffefa8,(float *)in_stack_ffffffffffffefa0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
             (float)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"constant for the learning rate 1/t",&local_a49);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffefa0,
             (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffefa0,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffeff0,(typed_option<float> *)in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb0,"normalize",&local_bb1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"normalize the features or not",&local_bd9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefa0,
       (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefa0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d40,"random_init",&local_d41);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffefa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d68,"randomize initialization of Oja or not",&local_d69);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffefa0,
       (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffefa0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_d40);
  std::allocator<char>::~allocator((allocator<char> *)&local_d41);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_a21);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  (**(code **)*local_10)(local_10,local_c8);
  plVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d90,"OjaNewton",&local_d91);
  bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_d90);
  std::__cxx11::string::~string(local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  pvVar1 = local_18;
  if (((bVar3 ^ 0xff) & 1) == 0) {
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3084ca);
    pOVar5->all = pvVar1;
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffefa0,
                            (char *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3084ff);
    pOVar5->normalize = bVar4;
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffefa0,
                            (char *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308539);
    pOVar5->random_init = bVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_db8,"alpha_inverse",&local_db9);
    bVar3 = (**(code **)(*local_10 + 8))(local_10,local_db8);
    std::__cxx11::string::~string(local_db8);
    std::allocator<char>::~allocator((allocator<char> *)&local_db9);
    if ((bVar3 & 1) != 0) {
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3085ff);
      pOVar5->alpha = 1.0 / local_30;
    }
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30866d);
    pOVar5->cnt = 0;
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308681);
    pOVar5->t = 1;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308695);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3086c1);
    pOVar5->ev = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3086da);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308706);
    pOVar5->b = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30871f);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30874b);
    pOVar5->D = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308764);
    ppfVar7 = calloc_or_throw<float*>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308790);
    pOVar5->A = ppfVar7;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3087a9);
    ppfVar7 = calloc_or_throw<float*>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3087cd);
    pOVar5->K = ppfVar7;
    for (local_dc0 = 1;
        pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                           ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3087ff),
        local_dc0 <= pOVar5->m; local_dc0 = local_dc0 + 1) {
      std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30881f);
      pfVar6 = calloc_or_throw<float>((size_t)nmemb);
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30884b);
      pOVar5->A[local_dc0] = pfVar6;
      std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308870);
      pfVar6 = calloc_or_throw<float>((size_t)nmemb);
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308894);
      pOVar5->K[local_dc0] = pfVar6;
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3088b9);
      pOVar5->A[local_dc0][local_dc0] = 1.0;
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3088eb);
      pOVar5->K[local_dc0][local_dc0] = 1.0;
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30891d);
      pOVar5->D[local_dc0] = 1.0;
    }
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308959);
    ppeVar8 = calloc_or_throw<example*>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308981);
    pOVar5->buffer = ppeVar8;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x30899a);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3089c2);
    pOVar5->weight_buffer = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x3089db);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308a07);
    pOVar5->zv = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308a20);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308a49);
    pOVar5->vv = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308a5f);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308a85);
    pOVar5->tmp = pfVar6;
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::get
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)in_stack_ffffffffffffefa0);
    pOVar9 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308aa7);
    (pOVar9->data).ON = pOVar5;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308aba);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308ae0);
    (pOVar5->data).Zx = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308af6);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308b1c);
    (pOVar5->data).AZx = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308b32);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    f = (_func_void_OjaNewton_ptr *)local_28;
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308b58);
    (pOVar5->data).delta = pfVar6;
    this_00 = (learner<OjaNewton,_example> *)&local_18->weights;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x308b81);
    __x = std::log2<int>(0);
    ceil(__x);
    parameters::stride_shift((parameters *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef9c);
    in_stack_ffffffffffffefb4 =
         parameters::stride((parameters *)
                            CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    this = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                     ((free_ptr<OjaNewton> *)
                      CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                      (_func_void_OjaNewton_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_ffffffffffffefa8,
                      (_func_void_OjaNewton_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_ffffffffffffefa0,
                      CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    LEARNER::learner<OjaNewton,_example>::set_save_load(this,save_load);
    LEARNER::learner<OjaNewton,_example>::set_finish_example(this,keep_example);
    LEARNER::learner<OjaNewton,_example>::set_finish(this_00,f);
    in_stack_ffffffffffffefa0 =
         (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)LEARNER::make_base<OjaNewton,example>(this);
    local_8 = in_stack_ffffffffffffefa0;
  }
  else {
    local_8 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  }
  local_d98 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)
             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
  return (base_learner *)local_8;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}